

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O0

void __thiscall imrt::ACS::generateTours(ACS *this)

{
  reference ppAVar1;
  long in_RDI;
  double dVar2;
  int a;
  double best_eval;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *in_stack_00000050;
  vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
  *in_stack_00000058;
  Ant *in_stack_00000060;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 1.79769313486232e+308;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x18); local_14 = local_14 + 1) {
    std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::operator[]
              ((vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_> *)(in_RDI + 0xd0),(long)local_14);
    Ant::generateTour(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::operator[]
              ((vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_> *)(in_RDI + 0xd0),(long)local_14);
    dVar2 = Ant::getEvaluation((Ant *)0x13d61a);
    if (dVar2 < local_10) {
      std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::operator[]
                ((vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_> *)(in_RDI + 0xd0),(long)local_14
                );
      local_10 = Ant::getEvaluation((Ant *)0x13d647);
      ppAVar1 = std::vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_>::operator[]
                          ((vector<imrt::Ant_*,_std::allocator<imrt::Ant_*>_> *)(in_RDI + 0xd0),
                           (long)local_14);
      *(value_type *)(in_RDI + 0xe8) = *ppAVar1;
    }
  }
  return;
}

Assistant:

void ACS::generateTours() {
    double best_eval=DBL_MAX;
    for (int a=0; a < n_ants; a++) {
      ants[a]->generateTour(probability, iprobability);
      if (ants[a]->getEvaluation() < best_eval) {
        best_eval = ants[a]->getEvaluation();
        iteration_best = ants[a];
      }
    }
  }